

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_output_auth(connectdata *conn,char *request,char *path,_Bool proxytunnel)

{
  SessionHandle *pSVar1;
  int iVar2;
  auth *authstatus;
  auth *authstatus_00;
  auth *authproxy;
  auth *authhost;
  SessionHandle *data;
  CURLcode result;
  _Bool proxytunnel_local;
  char *path_local;
  char *request_local;
  connectdata *conn_local;
  
  data._0_4_ = CURLE_OK;
  pSVar1 = conn->data;
  authstatus = &(pSVar1->state).authhost;
  authstatus_00 = &(pSVar1->state).authproxy;
  if (((((conn->bits).httpproxy & 1U) == 0) || (((conn->bits).proxy_user_passwd & 1U) == 0)) &&
     (((conn->bits).user_passwd & 1U) == 0)) {
    (pSVar1->state).authhost.done = true;
    (pSVar1->state).authproxy.done = true;
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if ((authstatus->want != 0) && ((pSVar1->state).authhost.picked == 0)) {
      (pSVar1->state).authhost.picked = authstatus->want;
    }
    if ((authstatus_00->want != 0) && ((pSVar1->state).authproxy.picked == 0)) {
      (pSVar1->state).authproxy.picked = authstatus_00->want;
    }
    if ((((conn->bits).httpproxy & 1U) == 0) ||
       ((_Bool)((conn->bits).tunnel_proxy & 1U) != proxytunnel)) {
      (pSVar1->state).authproxy.done = true;
    }
    else {
      data._0_4_ = output_auth_headers(conn,authstatus_00,request,path,true);
      if ((CURLcode)data != CURLE_OK) {
        return (CURLcode)data;
      }
    }
    if ((((((pSVar1->state).this_is_a_follow & 1U) == 0) || (((conn->bits).netrc & 1U) != 0)) ||
        ((pSVar1->state).first_host == (char *)0x0)) ||
       ((((pSVar1->set).http_disable_hostname_check_before_authentication & 1U) != 0 ||
        (iVar2 = Curl_raw_equal((pSVar1->state).first_host,(conn->host).name), iVar2 != 0)))) {
      data._0_4_ = output_auth_headers(conn,authstatus,request,path,false);
    }
    else {
      (pSVar1->state).authhost.done = true;
    }
    conn_local._4_4_ = (CURLcode)data;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode
Curl_http_output_auth(struct connectdata *conn,
                      const char *request,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if((conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
     conn->bits.user_passwd)
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
      (conn->bits.tunnel_proxy == proxytunnel)) {
    result = output_auth_headers(conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original
     host due to a location-follow, we do some weirdo checks here */
  if(!data->state.this_is_a_follow ||
     conn->bits.netrc ||
     !data->state.first_host ||
     data->set.http_disable_hostname_check_before_authentication ||
     Curl_raw_equal(data->state.first_host, conn->host.name)) {
    result = output_auth_headers(conn, authhost, request, path, FALSE);
  }
  else
    authhost->done = TRUE;

  return result;
}